

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void update_object_subwindow(game_event_type type,game_event_data *data,void *user)

{
  term *t;
  term_conflict *inv_term;
  term_conflict *old;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  t = Term;
  Term_activate((term *)user);
  if (player->upkeep->object == (object *)0x0) {
    if (player->upkeep->object_kind != (object_kind *)0x0) {
      display_object_kind_recall(player->upkeep->object_kind);
    }
  }
  else {
    display_object_recall(player->upkeep->object);
  }
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_object_subwindow(game_event_type type,
									game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;
	
	/* Activate */
	Term_activate(inv_term);
	
	if (player->upkeep->object != NULL)
		display_object_recall(player->upkeep->object);
	else if (player->upkeep->object_kind)
		display_object_kind_recall(player->upkeep->object_kind);
	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}